

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

bool __thiscall mp::NLSolver::LoadModel(NLSolver *this,NLModel *mdl)

{
  NLW2_NLOptionsBasic_C opts;
  byte bVar1;
  PreprocessData *in_RDI;
  NLFeeder_Easy nlf;
  pointer in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  NLFeeder_Easy *this_00;
  undefined4 in_stack_fffffffffffffd14;
  char *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  NLSolver *in_stack_fffffffffffffd38;
  
  this_00 = (NLFeeder_Easy *)&stack0xfffffffffffffd28;
  opts.flags_ = in_stack_fffffffffffffd30;
  opts._0_8_ = in_stack_fffffffffffffd28;
  NLFeeder_Easy::NLFeeder_Easy
            ((NLFeeder_Easy *)
             CONCAT44(in_stack_fffffffffffffd14,
                      *(undefined4 *)
                       ((long)&in_RDI[2].vperm_.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4)),
             *(NLModel **)
              ((long)&in_RDI[1].vperm_inv_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 4),opts);
  NLFeeder_Easy::ExportPreproData(this_00,in_RDI);
  operator_new(0x110);
  NLFeeder_Easy::Header
            ((NLFeeder_Easy *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
  std::unique_ptr<mp::NLHeader,_std::default_delete<mp::NLHeader>_>::reset
            ((unique_ptr<mp::NLHeader,_std::default_delete<mp::NLHeader>_> *)
             CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),in_stack_fffffffffffffcc8
            );
  bVar1 = LoadModel<mp::NLFeeder_Easy>
                    (in_stack_fffffffffffffd38,
                     (NLFeeder_Easy *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30))
  ;
  NLFeeder_Easy::~NLFeeder_Easy((NLFeeder_Easy *)CONCAT17(bVar1,in_stack_fffffffffffffcd0));
  return (bool)(bVar1 & 1);
}

Assistant:

bool NLSolver::LoadModel(const NLModel& mdl) {
  NLFeeder_Easy nlf(mdl, nl_opts_);
  nlf.ExportPreproData(pd_);
  p_nlheader_.reset(new NLHeader(nlf.Header()));
  return LoadModel(nlf);
}